

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O0

int ffukyg(fitsfile *fptr,char *keyname,double value,int decim,char *comm,int *status)

{
  int iVar1;
  int iVar2;
  int *in_R8;
  int tstatus;
  int *in_stack_00000060;
  char *in_stack_00000068;
  int in_stack_00000074;
  double in_stack_00000078;
  char *in_stack_00000080;
  fitsfile *in_stack_00000088;
  int *in_stack_000000b0;
  char *in_stack_000000b8;
  int in_stack_000000c4;
  double in_stack_000000c8;
  char *in_stack_000000d0;
  fitsfile *in_stack_000000d8;
  undefined4 local_4;
  
  if (*in_R8 < 1) {
    iVar1 = *in_R8;
    iVar2 = ffmkyg(in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,in_stack_000000c4,
                   in_stack_000000b8,in_stack_000000b0);
    if (iVar2 == 0xca) {
      *in_R8 = iVar1;
      ffpkyg(in_stack_00000088,in_stack_00000080,in_stack_00000078,in_stack_00000074,
             in_stack_00000068,in_stack_00000060);
    }
    local_4 = *in_R8;
  }
  else {
    local_4 = *in_R8;
  }
  return local_4;
}

Assistant:

int ffukyg(fitsfile *fptr,     /* I - FITS file pointer  */
           const char *keyname,/* I - keyword name       */
           double value,       /* I - keyword value      */
           int decim,          /* I - no of decimals     */
           const char *comm,   /* I - keyword comment    */
           int *status)        /* IO - error status      */
{
    int tstatus;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    tstatus = *status;

    if (ffmkyg(fptr, keyname, value, decim, comm, status) == KEY_NO_EXIST)
    {
        *status = tstatus;
        ffpkyg(fptr, keyname, value, decim, comm, status);
    }
    return(*status);
}